

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_animatable_timesamples<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,Animatable<std::array<float,_2UL>_> *v,
          uint32_t indent)

{
  bool bVar1;
  TypedTimeSamples<std::array<float,_2UL>_> *this_00;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  Animatable<std::array<float,_2UL>_> *pAStack_18;
  uint32_t indent_local;
  Animatable<std::array<float,_2UL>_> *v_local;
  
  local_1c = (uint)v;
  pAStack_18 = (Animatable<std::array<float,_2UL>_> *)this;
  v_local = (Animatable<std::array<float,_2UL>_> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = Animatable<std::array<float,_2UL>_>::has_timesamples(pAStack_18);
  if (bVar1) {
    this_00 = Animatable<std::array<float,_2UL>_>::get_timesamples(pAStack_18);
    print_typed_timesamples<std::array<float,2ul>>
              (&local_1c8,(tinyusdz *)this_00,
               (TypedTimeSamples<std::array<float,_2UL>_> *)(ulong)local_1c,indent);
    ::std::operator<<(aoStack_198,(string *)&local_1c8);
    ::std::__cxx11::string::~string((string *)&local_1c8);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_timesamples(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  std::stringstream ss;

  if (v.has_timesamples()) {
    ss << print_typed_timesamples(v.get_timesamples(), indent);
  }

  return ss.str();
}